

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar11;
  int iVar12;
  uint uVar13;
  _Alloc_hider _Var14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  size_type sVar18;
  char *pcVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_00128c2b;
  }
  cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar7 == '\0') {
    on_dec(this);
    goto LAB_00128c2b;
  }
  uVar13 = this->abs_value;
  uVar21 = 0x1f;
  if ((uVar13 | 1) != 0) {
    for (; (uVar13 | 1) >> uVar21 == 0; uVar21 = uVar21 - 1) {
    }
  }
  uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar21 * 2);
  bVar6 = uVar13 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar3 * 4);
  uVar20 = (uint)uVar3 - (uint)bVar6;
  _Var14._M_p = local_298._M_dataplus._M_p;
  uVar21 = uVar20;
  uVar8 = uVar20;
  if (local_298._M_string_length == 0) {
LAB_00128a38:
    uVar9 = uVar8;
    uVar15 = uVar21;
    if (_Var14._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_00128a43;
  }
  else {
    uVar15 = uVar20 + (int)local_298._M_string_length;
    sVar18 = local_298._M_string_length;
    do {
      cVar2 = *_Var14._M_p;
      uVar9 = uVar8 - (int)cVar2;
      if ((uVar9 == 0 || (int)uVar8 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00128a38;
      uVar21 = uVar21 + 1;
      _Var14._M_p = _Var14._M_p + 1;
      sVar18 = sVar18 - 1;
      uVar8 = uVar9;
    } while (sVar18 != 0);
LAB_00128a43:
    uVar15 = (int)(uVar9 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1] +
             uVar15;
  }
  pcVar10 = local_278 + (int)uVar20;
  uVar21 = uVar13;
  if (99 < uVar13) {
    do {
      uVar13 = uVar21 / 100;
      *(undefined2 *)(pcVar10 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar21 % 100) * 2);
      pcVar10 = pcVar10 + -2;
      bVar5 = 9999 < uVar21;
      uVar21 = uVar21 / 100;
    } while (bVar5);
  }
  if (uVar13 < 10) {
    pcVar10[-1] = (byte)uVar13 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar10 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar13 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014ace0;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar15 = uVar15 + this->prefix_size;
  uVar22 = (ulong)uVar15;
  if (500 < uVar15) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar22);
  }
  pcVar10 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar22 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar22;
  }
  pcVar19 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar15 + -1;
  if (1 < (int)uVar20) {
    uVar16 = (ulong)uVar20;
    iVar17 = ((uint)uVar3 - (uint)bVar6) + 1;
    iVar12 = 0;
    _Var14._M_p = local_298._M_dataplus._M_p;
    do {
      uVar16 = uVar16 - 1;
      pcVar1 = pcVar19 + -1;
      *pcVar19 = local_278[uVar16 & 0xffffffff];
      cVar2 = *_Var14._M_p;
      if ('\0' < cVar2) {
        iVar12 = iVar12 + 1;
        if ((cVar2 != '\x7f') && (iVar12 % (int)cVar2 == 0)) {
          if (_Var14._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
            iVar12 = 0;
            _Var14._M_p = _Var14._M_p + 1;
          }
          pcVar19[-1] = cVar7;
          pcVar1 = pcVar19 + -2;
        }
      }
      pcVar19 = pcVar1;
      iVar17 = iVar17 + -1;
    } while (2 < iVar17);
  }
  *pcVar19 = local_278[0];
  if (this->prefix_size != 0) {
    pcVar19[-1] = '-';
  }
  pbVar4 = this->specs;
  uVar16 = 0;
  if (uVar22 <= (uint)pbVar4->width) {
    uVar16 = (uint)pbVar4->width - uVar22;
  }
  uVar22 = uVar16 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
  bVar11 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                     ((this->out).container,uVar22,&pbVar4->fill);
  bVar11 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (pcVar10,pcVar10 + (int)uVar15,bVar11);
  bVar11 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                     (bVar11,uVar16 - uVar22,&pbVar4->fill);
  (this->out).container = bVar11.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
LAB_00128c2b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }